

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O0

_Bool check_watchpoints(ARMCPU_conflict1 *cpu)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint local_24;
  int n;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu_local;
  
  uVar2 = extract32((uint32_t)(cpu->env).cp15.mdscr_el1,0xf,1);
  if ((uVar2 != 0) && (_Var1 = arm_generate_debug_exceptions(&cpu->env), _Var1)) {
    local_24 = 0;
    while( true ) {
      if (0xf < local_24) {
        return false;
      }
      _Var1 = bp_wp_matches(cpu,local_24,true);
      if (_Var1) break;
      local_24 = local_24 + 1;
    }
    return true;
  }
  return false;
}

Assistant:

static bool check_watchpoints(ARMCPU *cpu)
{
    CPUARMState *env = &cpu->env;
    int n;

    /*
     * If watchpoints are disabled globally or we can't take debug
     * exceptions here then watchpoint firings are ignored.
     */
    if (extract32(env->cp15.mdscr_el1, 15, 1) == 0
        || !arm_generate_debug_exceptions(env)) {
        return false;
    }

    for (n = 0; n < ARRAY_SIZE(env->cpu_watchpoint); n++) {
        if (bp_wp_matches(cpu, n, true)) {
            return true;
        }
    }
    return false;
}